

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool percentile_iter_next(hdr_iter *iter)

{
  _Bool _Var1;
  int64_t iVar2;
  double dVar3;
  
  if (iter->cumulative_count < iter->total_count) {
    if ((iter->counts_index == -1) && (_Var1 = basic_iter_next(iter), !_Var1)) {
      return false;
    }
    do {
      if (iter->count != 0) {
        dVar3 = (iter->specifics).percentiles.percentile_to_iterate_to;
        if (dVar3 <= ((double)iter->cumulative_count * 100.0) / (double)iter->h->total_count) {
          iVar2 = highest_equivalent_value(iter->h,iter->value);
          iter->value_iterated_from = iter->value_iterated_to;
          iter->value_iterated_to = iVar2;
          (iter->specifics).percentiles.percentile = dVar3;
          dVar3 = log(100.0 / (100.0 - dVar3));
          dVar3 = exp2((double)((long)(dVar3 / 0.6931471805599453) + 1));
          (iter->specifics).percentiles.percentile_to_iterate_to =
               100.0 / (double)((long)(iter->specifics).percentiles.ticks_per_half_distance *
                               (long)dVar3) + (iter->specifics).percentiles.percentile_to_iterate_to
          ;
          return true;
        }
      }
      _Var1 = basic_iter_next(iter);
    } while (_Var1);
  }
  else {
    if ((iter->specifics).percentiles.seen_last_value != false) {
      return false;
    }
    (iter->specifics).percentiles.seen_last_value = true;
    (iter->specifics).linear.next_value_reporting_level = 0x4059000000000000;
  }
  return true;
}

Assistant:

static bool percentile_iter_next(struct hdr_iter* iter)
{
    int64_t temp, half_distance, percentile_reporting_ticks;

    struct hdr_iter_percentiles* percentiles = &iter->specifics.percentiles;

    if (!has_next(iter))
    {
        if (percentiles->seen_last_value)
        {
            return false;
        }

        percentiles->seen_last_value = true;
        percentiles->percentile = 100.0;

        return true;
    }

    if (iter->counts_index == -1 && !basic_iter_next(iter))
    {
        return false;
    }

    do
    {
        double current_percentile = (100.0 * (double) iter->cumulative_count) / iter->h->total_count;
        if (iter->count != 0 &&
                percentiles->percentile_to_iterate_to <= current_percentile)
        {
            update_iterated_values(iter, highest_equivalent_value(iter->h, iter->value));

            percentiles->percentile = percentiles->percentile_to_iterate_to;
            temp = (int64_t)(log(100 / (100.0 - (percentiles->percentile_to_iterate_to))) / log(2)) + 1;
            half_distance = (int64_t) pow(2, (double) temp);
            percentile_reporting_ticks = percentiles->ticks_per_half_distance * half_distance;
            percentiles->percentile_to_iterate_to += 100.0 / percentile_reporting_ticks;

            return true;
        }
    }
    while (basic_iter_next(iter));

    return true;
}